

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CordInputStream::Next(CordInputStream *this,void **data,int *size)

{
  bool bVar1;
  int *size_local;
  void **data_local;
  CordInputStream *this_local;
  
  if ((this->available_ == 0) && (bVar1 = NextChunk(this,0), !bVar1)) {
    return false;
  }
  *data = this->data_ + (this->size_ - this->available_);
  *size = (int)this->available_;
  this->bytes_remaining_ = this->bytes_remaining_ - this->available_;
  this->available_ = 0;
  return true;
}

Assistant:

bool CordInputStream::Next(const void** data, int* size) {
  if (available_ > 0 || NextChunk(0)) {
    *data = data_ + size_ - available_;
    *size = available_;
    bytes_remaining_ -= available_;
    available_ = 0;
    return true;
  }
  return false;
}